

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O2

NewScopeLayer * __thiscall NewScopeLayer::GetVariableLayer(NewScopeLayer *this,Symbol *symbol)

{
  bool bVar1;
  runtime_error *this_00;
  NewScopeLayer *this_01;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  do {
    this_01 = this;
    bVar1 = HasVariable(this_01,symbol);
    if (bVar1) break;
    this = this_01->parent_;
  } while (this_01->parent_->parent_ != (NewScopeLayer *)0x0);
  bVar1 = HasVariable(this_01,symbol);
  if (bVar1) {
    return this_01;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  Symbol::GetName_abi_cxx11_(&sStack_78,symbol);
  std::operator+(&local_58,"Variable ",&sStack_78);
  std::operator+(&local_38,&local_58," is not declared");
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

NewScopeLayer* NewScopeLayer::GetVariableLayer(const Symbol& symbol) {
  NewScopeLayer* current = this;

  while (!current->HasVariable(symbol) &&
         current->parent_->parent_ != nullptr) {
    current = current->parent_;
  }

  if (current->HasVariable(symbol)) {
    return current;
  }

  throw std::runtime_error("Variable " + symbol.GetName() + " is not declared");
}